

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_edge_detection.cpp
# Opt level: O3

bool edge_detection::DetectHorizontalEdge<double>(void)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint32_t width;
  uint32_t y;
  uint8_t value;
  uint32_t uVar4;
  uint uVar5;
  undefined4 uVar6;
  pointer pPVar7;
  undefined4 uVar8;
  uint32_t *x;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [16];
  undefined1 in_XMM4 [16];
  uint32_t roiHeight;
  uint32_t roiX;
  undefined4 local_d0;
  undefined4 local_cc;
  uint32_t local_c8;
  uint local_c4;
  uint32_t roiWidth;
  uint32_t roiY;
  EdgeDetectionBase<double> edgeDetection;
  Image image;
  EdgeParameter local_50;
  
  uVar4 = Test_Helper::runCount();
  if (uVar4 == 0) {
    return true;
  }
  uVar5 = 0;
LAB_001361ba:
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&edgeDetection,0,0,'\x01','\x01');
  Unit_Test::blackImage(&image,(Image *)&edgeDetection);
  edgeDetection.positiveEdgePoint.
  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear
            ((ImageTemplate<unsigned_char> *)&edgeDetection);
  x = &roiX;
  Unit_Test::generateRoi(&image,x,&roiY,&roiWidth,&roiHeight);
  y = roiY;
  width = roiWidth;
  uVar4 = roiX;
  auVar11 = in_ZMM1._0_16_;
  iVar1 = roiWidth + roiX;
  if (roiX < 2) {
    if (roiX != 0) {
      uVar8 = 0;
      goto LAB_00136237;
    }
    uVar8 = 0;
    uVar6 = 0;
  }
  else {
    uVar8 = (undefined4)CONCAT71((int7)((ulong)x >> 8),roiX + 1 < image._width);
LAB_00136237:
    uVar6 = CONCAT31((int3)(image._width >> 8),iVar1 + 2U < image._width);
  }
  local_c4 = uVar5;
  if (((char)uVar8 != '\0') || (bVar3 = false, (char)uVar6 != '\0')) {
    local_c8 = roiHeight;
    local_d0 = uVar6;
    local_cc = uVar8;
    uVar5 = rand();
    value = (uint8_t)uVar5;
    if ((uVar5 & 0xc0) == 0) {
      value = '@';
    }
    Unit_Test::fillImage(&image,uVar4,y,width,local_c8,value);
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgeDetection.positiveEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgeDetection.negativeEdgePoint.
    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    in_ZMM1 = ZEXT1664(auVar11);
    EdgeParameter::EdgeParameter(&local_50,LEFT_TO_RIGHT,ANY,ALL,1,1,0,0,'\n');
    EdgeDetectionBase<double>::find(&edgeDetection,&image,0,0,image._width,image._height,&local_50);
    if ((((char)local_cc == '\0') ||
        (bVar3 = true,
        (long)edgeDetection.positiveEdgePoint.
              super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)edgeDetection.positiveEdgePoint.
              super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl
              .super__Vector_impl_data._M_start >> 4 == (ulong)roiHeight)) &&
       (((char)local_d0 == '\0' ||
        (bVar3 = true,
        (long)edgeDetection.negativeEdgePoint.
              super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)edgeDetection.negativeEdgePoint.
              super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl
              .super__Vector_impl_data._M_start >> 4 == (ulong)roiHeight)))) {
      auVar11._8_8_ = 0x7fffffffffffffff;
      auVar11._0_8_ = 0x7fffffffffffffff;
      if (edgeDetection.positiveEdgePoint.
          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          edgeDetection.positiveEdgePoint.
          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,roiX);
        pPVar7 = edgeDetection.positiveEdgePoint.
                 super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = pPVar7->x - auVar2._0_8_;
          auVar9 = vandpd_avx(auVar9,auVar11);
          in_ZMM1 = ZEXT1664(auVar9);
          if (1.0 < auVar9._0_8_) goto LAB_001363d5;
          pPVar7 = pPVar7 + 1;
        } while (pPVar7 != edgeDetection.positiveEdgePoint.
                           super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (edgeDetection.negativeEdgePoint.
          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
          super__Vector_impl_data._M_start ==
          edgeDetection.negativeEdgePoint.
          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar3 = false;
      }
      else {
        auVar2 = vcvtusi2sd_avx512f(in_XMM4,iVar1);
        pPVar7 = edgeDetection.negativeEdgePoint.
                 super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = pPVar7->x - auVar2._0_8_;
          auVar9 = vandpd_avx(auVar10,auVar11);
          in_ZMM1 = ZEXT1664(auVar9);
          if (1.0 < auVar9._0_8_) goto LAB_001363d5;
          pPVar7 = pPVar7 + 1;
        } while (pPVar7 != edgeDetection.negativeEdgePoint.
                           super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        bVar3 = false;
      }
    }
    goto LAB_001363df;
  }
  goto LAB_001363f8;
LAB_001363d5:
  bVar3 = true;
LAB_001363df:
  if (edgeDetection.negativeEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(edgeDetection.negativeEdgePoint.
                    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (edgeDetection.positiveEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(edgeDetection.positiveEdgePoint.
                    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_001363f8:
  image._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&image);
  if (bVar3) {
    return false;
  }
  uVar5 = local_c4 + 1;
  uVar4 = Test_Helper::runCount();
  if (uVar4 <= uVar5) {
    return true;
  }
  goto LAB_001361ba;
}

Assistant:

bool DetectHorizontalEdge()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            PenguinV_Image::Image image = Unit_Test::blackImage();

            uint32_t roiX, roiY;
            uint32_t roiWidth, roiHeight;
            Unit_Test::generateRoi( image, roiX, roiY, roiWidth, roiHeight );

            const uint32_t roiXEnd = roiX + roiWidth;
            const bool isValidLeftEdge  = ( roiX > 1u ) && ( roiX    + 1u < image.width() );
            const bool isValidRightEdge = ( roiX > 0u ) && ( roiXEnd + 2u < image.width() );

            if ( !isValidLeftEdge && !isValidRightEdge )
                continue;

            Unit_Test::fillImage( image, roiX, roiY, roiWidth, roiHeight, Unit_Test::randomValue<uint8_t>( 64, 256 ) );

            EdgeDetectionBase<_Type> edgeDetection;
            edgeDetection.find( image, EdgeParameter( EdgeParameter::LEFT_TO_RIGHT) );

            const std::vector< PointBase2D<_Type> > & positive = edgeDetection.positiveEdge();
            const std::vector< PointBase2D<_Type> > & negative = edgeDetection.negativeEdge();

            if ( ( isValidLeftEdge && (positive.size() != roiHeight) ) || ( isValidRightEdge && (negative.size() != roiHeight) ) )
                return false;

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = positive.cbegin(); point != positive.cend(); ++point ) {
                if ( fabs( point->x - roiX ) > 1.0 )
                    return false;
            }

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = negative.cbegin(); point != negative.cend(); ++point ) {
                if ( fabs( point->x - roiXEnd ) > 1.0 )
                    return false;
            }
        }

        return true;
    }